

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_addref(HSQUIRRELVM v,HSQOBJECT *po)

{
  if ((po->_type & 0x8000000) == 0) {
    return;
  }
  RefTable::AddRef(&v->_sharedstate->_refs_table,po);
  return;
}

Assistant:

void sq_addref(HSQUIRRELVM v,HSQOBJECT *po)
{
    if(!ISREFCOUNTED(sq_type(*po))) return;
#ifdef NO_GARBAGE_COLLECTOR
    __AddRef(po->_type,po->_unVal);
#else
    _ss(v)->_refs_table.AddRef(*po);
#endif
}